

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

int socket_server_connect(socket_server *ss,uintptr_t opaque,char *addr,int port)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  request_package request;
  request_package rStack_238;
  
  sVar2 = strlen(addr);
  iVar3 = (int)sVar2;
  sVar2 = (size_t)iVar3;
  if (sVar2 - 0xe8 < 0xffffffffffffff00) {
    fprintf(_stderr,"socket-server : Invalid addr %s.\n",addr);
  }
  else {
    iVar1 = reserve_id(ss);
    if (-1 < iVar1) {
      rStack_238.u.open.id = iVar1;
      rStack_238.u.open.port = port;
      rStack_238.u.open.opaque = opaque;
      memcpy((void *)((long)&rStack_238.u + 0x10),addr,sVar2);
      rStack_238.header[sVar2 + 0x18] = '\0';
      goto LAB_00110ec0;
    }
  }
  iVar3 = -1;
LAB_00110ec0:
  if (iVar3 < 0) {
    rStack_238.u.open.id = -1;
  }
  else {
    send_request(ss,&rStack_238,'O',iVar3 + 0x18);
  }
  return rStack_238.u.open.id;
}

Assistant:

int 
socket_server_connect(struct socket_server *ss, uintptr_t opaque, const char * addr, int port) {
	struct request_package request;
	int len = open_request(ss, &request, opaque, addr, port);
	if (len < 0)
		return -1;
	send_request(ss, &request, 'O', sizeof(request.u.open) + len);
	return request.u.open.id;
}